

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O3

void aom_dc_left_predictor_16x4_c(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint8_t *puVar4;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined4 uVar5;
  undefined1 auVar8 [16];
  
  auVar8 = psadbw((undefined1  [16])0x0,ZEXT416(*(uint *)left));
  uVar2 = auVar8._0_4_ + 2;
  uVar3 = uVar2 >> 2;
  bVar1 = (byte)(uVar2 >> 0x18);
  uVar7 = (undefined1)(uVar3 >> 0x10);
  uVar6 = (undefined1)(uVar3 >> 8);
  auVar8._4_4_ = (int)(CONCAT35(CONCAT21(CONCAT11(bVar1 >> 2,bVar1 >> 2),uVar7),
                                CONCAT14(uVar7,uVar3)) >> 0x20);
  auVar8[3] = uVar6;
  auVar8[2] = uVar6;
  auVar8[0] = (undefined1)uVar3;
  auVar8[1] = auVar8[0];
  auVar8._8_8_ = 0;
  auVar8 = pshuflw(auVar8,auVar8,0);
  uVar5 = auVar8._0_4_;
  *(undefined4 *)dst = uVar5;
  *(undefined4 *)(dst + 4) = uVar5;
  *(undefined4 *)(dst + 8) = uVar5;
  *(undefined4 *)(dst + 0xc) = uVar5;
  puVar4 = dst + stride;
  *(undefined4 *)puVar4 = uVar5;
  *(undefined4 *)(puVar4 + 4) = uVar5;
  *(undefined4 *)(puVar4 + 8) = uVar5;
  *(undefined4 *)(puVar4 + 0xc) = uVar5;
  puVar4 = dst + stride * 2;
  *(undefined4 *)puVar4 = uVar5;
  *(undefined4 *)(puVar4 + 4) = uVar5;
  *(undefined4 *)(puVar4 + 8) = uVar5;
  *(undefined4 *)(puVar4 + 0xc) = uVar5;
  puVar4 = dst + stride * 3;
  *(undefined4 *)puVar4 = uVar5;
  *(undefined4 *)(puVar4 + 4) = uVar5;
  *(undefined4 *)(puVar4 + 8) = uVar5;
  *(undefined4 *)(puVar4 + 0xc) = uVar5;
  return;
}

Assistant:

static inline void dc_left_predictor(uint8_t *dst, ptrdiff_t stride, int bw,
                                     int bh, const uint8_t *above,
                                     const uint8_t *left) {
  int i, r, expected_dc, sum = 0;
  (void)above;

  for (i = 0; i < bh; i++) sum += left[i];
  expected_dc = (sum + (bh >> 1)) / bh;

  for (r = 0; r < bh; r++) {
    memset(dst, expected_dc, bw);
    dst += stride;
  }
}